

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  int iVar1;
  Location *pLVar2;
  Rep *pRVar3;
  Arena *this_00;
  LogMessage *pLVar4;
  string *elem;
  pointer __pos;
  ulong uVar5;
  LogFinisher local_a9;
  LocationRecorder *local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_a8 = this;
  if (((this->location_->_has_bits_).has_bits_[0] & 1) != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x198);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !location_->has_leading_comments(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (((local_a8->location_->_has_bits_).has_bits_[0] & 2) != 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x199);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: !location_->has_trailing_comments(): ");
    internal::LogFinisher::operator=(&local_a9,pLVar4);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if (leading->_M_string_length != 0) {
    pLVar2 = local_a8->location_;
    (pLVar2->_has_bits_).has_bits_[0] = (pLVar2->_has_bits_).has_bits_[0] | 1;
    if ((pLVar2->leading_comments_).ptr_ ==
        (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&pLVar2->leading_comments_,
                 (string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)(pLVar2->leading_comments_).ptr_);
  }
  if (trailing->_M_string_length != 0) {
    pLVar2 = local_a8->location_;
    (pLVar2->_has_bits_).has_bits_[0] = (pLVar2->_has_bits_).has_bits_[0] | 2;
    if ((pLVar2->trailing_comments_).ptr_ ==
        (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&pLVar2->trailing_comments_,
                 (string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)(pLVar2->trailing_comments_).ptr_);
  }
  __pos = (detached_comments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((detached_comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != __pos) {
    uVar5 = 0;
    do {
      pLVar2 = local_a8->location_;
      pRVar3 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar3 == (Rep *)0x0) {
LAB_002cd235:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase,
                   (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002cd244:
        pRVar3 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        pRVar3->allocated_size = pRVar3->allocated_size + 1;
        this_00 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.arena_;
        if (this_00 == (Arena *)0x0) {
          elem = (string *)operator_new(0x20);
          *(string **)elem = elem + 0x10;
          *(long *)(elem + 8) = 0;
          elem[0x10] = (string)0x0;
        }
        else {
          elem = (string *)
                 Arena::AllocateAligned(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          *(string **)elem = elem + 0x10;
          *(long *)(elem + 8) = 0;
          elem[0x10] = (string)0x0;
          Arena::AddListNode(this_00,elem,internal::arena_destruct_object<std::__cxx11::string>);
        }
        pRVar3 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
        (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar3->elements[iVar1] = elem;
      }
      else {
        iVar1 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar3->allocated_size <= iVar1) {
          if (pRVar3->allocated_size ==
              (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002cd235;
          goto LAB_002cd244;
        }
        (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        elem = (string *)pRVar3->elements[iVar1];
      }
      std::__cxx11::string::swap(elem);
      uVar5 = uVar5 + 1;
      __pos = (detached_comments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(detached_comments->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)__pos >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(detached_comments,__pos);
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    string* leading, string* trailing,
    std::vector<string>* detached_comments) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap(
        (*detached_comments)[i]);
  }
  detached_comments->clear();
}